

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PaddingLayerParams::MergeFrom
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingConstant *this_01;
  PaddingLayerParams_PaddingConstant *from_00;
  PaddingLayerParams_PaddingReflection *this_02;
  PaddingLayerParams_PaddingReflection *from_01;
  PaddingLayerParams_PaddingReplication *this_03;
  PaddingLayerParams_PaddingReplication *from_02;
  BorderAmounts *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x87d1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) &&
     (from->paddingamounts_ != (BorderAmounts *)0x0)) {
    this_00 = mutable_paddingamounts(this);
    from_03 = from->paddingamounts_;
    if (from_03 == (BorderAmounts *)0x0) {
      from_03 = (BorderAmounts *)&_BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this_00,from_03);
  }
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 3) {
    this_03 = mutable_replication(this);
    from_02 = replication(from);
    PaddingLayerParams_PaddingReplication::MergeFrom(this_03,from_02);
  }
  else if (uVar1 == 2) {
    this_02 = mutable_reflection(this);
    from_01 = reflection(from);
    PaddingLayerParams_PaddingReflection::MergeFrom(this_02,from_01);
  }
  else if (uVar1 == 1) {
    this_01 = mutable_constant(this);
    from_00 = constant(from);
    PaddingLayerParams_PaddingConstant::MergeFrom(this_01,from_00);
  }
  return;
}

Assistant:

void PaddingLayerParams::MergeFrom(const PaddingLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PaddingLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_paddingamounts()) {
    mutable_paddingamounts()->::CoreML::Specification::BorderAmounts::MergeFrom(from.paddingamounts());
  }
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
}